

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::ScriptFunctionWithInlineCache::FreeOwnInlineCaches<false>(ScriptFunctionWithInlineCache *this)

{
  uint uVar1;
  Type TVar2;
  uint uVar3;
  InlineCache *this_00;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  ParseableFunctionInfo *this_01;
  ScriptContext *pSVar7;
  undefined4 *puVar8;
  ulong uVar9;
  InlineCache *inlineCache;
  ulong uVar10;
  uint local_34;
  
  if (((this->super_ScriptFunction).hasInlineCaches == true) &&
     ((this->m_inlineCaches).ptr != (void **)0x0)) {
    uVar1 = this->inlineCacheCount;
    uVar10 = (ulong)uVar1;
    TVar2 = this->isInstInlineCacheCount;
    this_01 = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)this);
    pSVar7 = FunctionProxy::GetScriptContext(&this_01->super_FunctionProxy);
    uVar3 = this->rootObjectLoadInlineCacheStart;
    local_34 = 0;
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      this_00 = (InlineCache *)(this->m_inlineCaches).ptr[uVar9];
      if (this_00 != (InlineCache *)0x0) {
        iVar6 = (*(pSVar7->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar7);
        if ((char)iVar6 == '\0') {
          bVar5 = InlineCache::RemoveFromInvalidationList(this_00);
          local_34 = local_34 + bVar5;
          Memory::
          DeleteObject<Memory::InlineCacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::InlineCache>
                    (&pSVar7->inlineCacheAllocator,this_00);
        }
        (this->m_inlineCaches).ptr[uVar9] = (void *)0x0;
      }
    }
    for (; uVar10 < TVar2 + uVar1; uVar10 = uVar10 + 1) {
      if ((this->m_inlineCaches).ptr[uVar10] != (void *)0x0) {
        iVar6 = (*(pSVar7->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar7);
        if ((char)iVar6 == '\0') {
          Memory::
          DeleteObject<Memory::CacheAllocator,(Memory::AllocatorDeleteFlags)0,Js::IsInstInlineCache>
                    (&pSVar7->isInstInlineCacheAllocator,
                     (IsInstInlineCache *)(this->m_inlineCaches).ptr[uVar10]);
        }
        (this->m_inlineCaches).ptr[uVar10] = (void *)0x0;
      }
    }
    if (local_34 != 0) {
      iVar6 = (*(pSVar7->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar7);
      if ((char)iVar6 != '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                    ,0x2d0,"(!isShutdown && !scriptContext->IsClosed())",
                                    "Unregistration of inlineCache should only be done if this is not shutdown or scriptContext closing."
                                   );
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      ThreadContext::NotifyInlineCacheBatchUnregistered(pSVar7->threadContext,local_34);
      return;
    }
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::FreeOwnInlineCaches()
    {
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        if (this->GetHasInlineCaches() && this->m_inlineCaches)
        {
            Js::ScriptContext* scriptContext = this->GetParseableFunctionInfo()->GetScriptContext();
            uint i = 0;
            uint unregisteredInlineCacheCount = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd < totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                if (this->m_inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)(void*)this->m_inlineCaches[i];
                    if (isShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else if(!scriptContext->IsClosed())
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                    this->m_inlineCaches[i] = nullptr;
                }
            }

            i = isInstInlineCacheStart;
            for (; i < totalCacheCount; i++)
            {
                if (this->m_inlineCaches[i])
                {
                    if (isShutdown)
                    {
                        ((IsInstInlineCache*)this->m_inlineCaches[i])->Clear();
                    }
                    else if (!scriptContext->IsClosed())
                    {
                        AllocatorDelete(CacheAllocator, scriptContext->GetIsInstInlineCacheAllocator(), (IsInstInlineCache*)(void*)this->m_inlineCaches[i]);
                    }
                    this->m_inlineCaches[i] = nullptr;
                }
            }

            if (unregisteredInlineCacheCount > 0)
            {
                AssertMsg(!isShutdown && !scriptContext->IsClosed(), "Unregistration of inlineCache should only be done if this is not shutdown or scriptContext closing.");
                scriptContext->GetThreadContext()->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
            }
        }
    }